

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O3

size_t object_desc(char *buf,size_t max,object *obj,uint32_t mode,player *p)

{
  short sVar1;
  object *poVar2;
  _Bool _Var3;
  _Bool _Var4;
  char cVar5;
  bool bVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  size_t sVar11;
  size_t sVar12;
  object *poVar13;
  object *poVar14;
  char *pcVar15;
  long lVar16;
  int iVar17;
  char *pcVar18;
  int16_t iVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  char *pcVar23;
  object_kind *poVar24;
  player *ppVar25;
  bool bVar26;
  _Bool pluralise;
  size_t local_a0;
  object *local_98;
  player *local_90;
  size_t local_88;
  uint local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if ((obj == (object *)0x0) || (obj->known == (object *)0x0)) {
    pcVar18 = "(nothing)";
LAB_00189800:
    sVar11 = strnfmt(buf,max,pcVar18);
    return sVar11;
  }
  if (obj->kind != obj->known->kind) {
    if ((mode & 0x40) == 0) {
      pcVar18 = "unknown item";
    }
    else {
      pcVar18 = "an unknown item";
    }
    goto LAB_00189800;
  }
  _Var3 = tval_is_money(obj);
  if (_Var3) {
    sVar1 = obj->pval;
    pcVar18 = obj->kind->name;
    _Var3 = ignore_item_ok(p,obj);
    pcVar23 = "";
    if (_Var3) {
      pcVar23 = " {ignore}";
    }
    sVar11 = strnfmt(buf,max,"%d gold pieces worth of %s%s",(ulong)(uint)(int)sVar1,pcVar18,pcVar23)
    ;
    return sVar11;
  }
  if (((mode & 0x20) == 0) && (obj->known->ego != (ego_item *)0x0)) {
    obj->ego->everseen = true;
  }
  local_88 = max;
  _Var3 = object_flavor_is_aware(obj);
  if (((mode & 0x20) == 0) && (_Var3)) {
    obj->kind->everseen = true;
  }
  local_a0 = 0;
  if ((mode >> 10 & 1) == 0) {
    uVar20 = (uint)obj->number;
  }
  else {
    uVar20 = mode >> 0x10;
  }
  _Var3 = object_flavor_is_aware(obj);
  if (((mode & 0x10) == 0) && (obj->artifact == (artifact *)0x0)) {
    pluralise = (mode & 8) != 0 || uVar20 != 1;
  }
  else {
    pluralise = false;
  }
  local_98 = obj;
  if (obj->known == (object *)0x0) {
    bVar26 = false;
  }
  else {
    _Var4 = flag_has_dbg(obj->known->flags,6,0x2a,"obj->known->flags","OF_PERFECT_BALANCE");
    if (_Var4) {
      bVar26 = obj->artifact == (artifact *)0x0;
    }
    else {
      bVar26 = false;
    }
  }
  local_7c = (uint)(byte)((byte)((mode & 0x20) >> 5) | _Var3 | (byte)((mode & 4) >> 2));
  _Var3 = false;
  if (((mode >> 8 & 1) == 0) && (_Var3 = true, obj->kind->flavor == (flavor *)0x0)) {
    _Var3 = tval_is_jewelry(obj);
  }
  _Var4 = false;
  if ((mode & 4) == 0) {
    _Var4 = _Var3;
  }
  _Var3 = _Var4;
  if (((char)local_7c == '\x01' && p != (player *)0x0) && (_Var3 = false, (p->opts).opt[7] != false)
     ) {
    _Var3 = _Var4;
  }
  local_90 = p;
  if ((obj->artifact != (artifact *)0x0) &&
     ((((char)local_7c != '\0' ||
       (_Var4 = object_is_known_artifact(local_98), obj = local_98, _Var4 || (mode & 0x100) != 0))
      || (local_98->kind->flavor == (flavor *)0x0)))) {
    _Var3 = tval_is_wearable(obj);
    poVar13 = obj;
    if (!_Var3) {
      poVar13 = (object *)&obj->kind->base;
    }
    pcVar18 = poVar13->kind->name;
    goto LAB_00189b9a;
  }
  switch(obj->tval) {
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\b':
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x1b':
  case '\x1c':
    pcVar18 = obj->kind->name;
    goto LAB_00189b9a;
  case '\x14':
    pcVar23 = "& # Amulet~";
    pcVar18 = "& Amulet~";
    break;
  case '\x15':
    pcVar23 = "& # Ring~";
    pcVar18 = "& Ring~";
    break;
  case '\x16':
    pcVar23 = "& # Sta|ff|ves|";
    pcVar18 = "& Sta|ff|ves|";
    break;
  case '\x17':
    pcVar23 = "& # Wand~";
    pcVar18 = "& Wand~";
    break;
  case '\x18':
    pcVar23 = "& # Rod~";
    pcVar18 = "& Rod~";
    break;
  case '\x19':
    pcVar23 = "& Scroll~ titled #";
    pcVar18 = "& Scroll~";
    break;
  case '\x1a':
    pcVar23 = "& # Potion~";
    pcVar18 = "& Potion~";
    break;
  case '\x1d':
    pcVar23 = "& # Mushroom~";
    pcVar18 = "& Mushroom~";
    break;
  case '\x1e':
    pcVar23 = "& Book~ #";
    pcVar18 = "& Book~ of Magic Spells #";
    goto LAB_00189b90;
  case '\x1f':
    pcVar23 = "& Book~ #";
    pcVar18 = "& Holy Book~ of Prayers #";
    goto LAB_00189b90;
  case ' ':
    pcVar23 = "& Book~ #";
    pcVar18 = "& Book~ of Nature Magics #";
    goto LAB_00189b90;
  case '!':
    pcVar23 = "& Tome~ #";
    pcVar18 = "& Necromantic Tome~ #";
    goto LAB_00189b90;
  case '\"':
    pcVar23 = "& Book~ #";
    pcVar18 = "& Book of Mysteries~ #";
LAB_00189b90:
    bVar6 = (mode & 0x100) == 0;
    goto LAB_00189b96;
  default:
    pcVar18 = "(nothing)";
    goto LAB_00189b9a;
  }
  bVar6 = _Var3 == false;
LAB_00189b96:
  if (!bVar6) {
    pcVar18 = pcVar23;
  }
LAB_00189b9a:
  sVar11 = local_88;
  poVar24 = obj->kind;
  _Var3 = tval_can_have_flavor_k(poVar24);
  if (_Var3) {
    poVar24 = (object_kind *)poVar24->flavor;
    if (poVar24 == (object_kind *)0x0) goto LAB_00189bda;
LAB_00189bd5:
    pcVar23 = poVar24->name;
  }
  else {
    _Var3 = tval_is_book_k(poVar24);
    if ((_Var3) || (_Var3 = tval_is_jewelry_k(poVar24), _Var3)) goto LAB_00189bd5;
LAB_00189bda:
    pcVar23 = "";
  }
  if ((mode & 0x40) == 0) {
    sVar12 = 0;
  }
  else {
    local_78 = 0;
    if ((short)uVar20 == 1) {
      _Var3 = object_is_known_artifact(local_98);
      if (_Var3) {
        pcVar15 = "the ";
        goto LAB_00189c2e;
      }
      pcVar15 = pcVar18;
      if (*pcVar18 != '&') goto LAB_00189c98;
      do {
        cVar5 = pcVar15[1];
        pcVar15 = pcVar15 + 1;
      } while (cVar5 == ' ');
      if (cVar5 == '#') {
        if (pcVar23 != (char *)0x0) {
          cVar5 = *pcVar23;
          goto LAB_00189c84;
        }
        bVar6 = true;
      }
      else {
LAB_00189c84:
        _Var3 = is_a_vowel((int)cVar5);
        bVar6 = !_Var3;
      }
      if ((mode >> 8 & 1) == 0) {
        if (bVar6 || bVar26) {
          pcVar15 = "a ";
        }
        else {
          pcVar15 = "an ";
        }
        goto LAB_00189c2e;
      }
    }
    else if (uVar20 == 0) {
      pcVar15 = "no more ";
LAB_00189c2e:
      strnfcat(buf,sVar11,&local_78,pcVar15);
    }
    else {
      strnfcat(buf,sVar11,&local_78,"%u ");
    }
LAB_00189c98:
    sVar12 = local_78;
    if (bVar26) {
      strnfcat(buf,sVar11,&local_78,"well-balanced ");
      sVar12 = local_78;
    }
  }
  local_a0 = obj_desc_name_format(buf,sVar11,sVar12,pcVar18,pcVar23,pluralise);
  poVar13 = local_98;
  _Var3 = object_is_known_artifact(local_98);
  if (_Var3) {
    pcVar18 = poVar13->artifact->name;
LAB_00189d5d:
    pcVar23 = " %s";
LAB_00189d64:
    strnfcat(buf,sVar11,&local_a0,pcVar23,pcVar18);
  }
  else {
    if (((mode >> 9 & 1) == 0 && poVar13->known->ego != (ego_item *)0x0) ||
       ((mode & 4) != 0 && poVar13->ego != (ego_item *)0x0)) {
      pcVar18 = poVar13->ego->name;
      goto LAB_00189d5d;
    }
    if ((((char)local_7c != '\0') && (poVar13->artifact == (artifact *)0x0)) &&
       ((poVar24 = poVar13->kind, poVar24->flavor != (flavor *)0x0 || (poVar24->tval == L'\x19'))))
    {
      pcVar18 = poVar24->name;
      if ((mode >> 8 & 1) == 0) {
        pcVar23 = " of %s";
      }
      else {
        pcVar23 = " \'%s\'";
      }
      goto LAB_00189d64;
    }
  }
  sVar12 = local_a0;
  if ((mode & 1) == 0) goto LAB_0018a12f;
  _Var3 = tval_is_chest(poVar13);
  if (_Var3) {
    sVar12 = obj_desc_chest(poVar13,buf,sVar11,sVar12);
  }
  else {
    _Var3 = tval_is_light(poVar13);
    if (_Var3) {
      sVar12 = obj_desc_light(poVar13,buf,sVar11,sVar12);
    }
  }
  ppVar25 = player;
  poVar2 = poVar13->known;
  local_78 = sVar12;
  if ((player->state).shield_on_back == true) {
    wVar7 = slot_by_name(player,"arm");
    poVar13 = slot_object(ppVar25,wVar7);
    if (poVar13 != poVar2) goto LAB_00189dff;
    iVar19 = poVar2->ac / 3;
  }
  else {
LAB_00189dff:
    iVar19 = poVar2->ac;
  }
  _Var3 = flag_has_dbg(poVar2->kind->kind_flags,4,0x16,"obj->kind->kind_flags","KF_SHOW_DICE");
  if ((_Var3) &&
     ((local_90 == (player *)0x0 || ((local_90->obj_k->dd != '\0' && (local_90->obj_k->ds != '\0')))
      ))) {
    strnfcat(buf,sVar11,&local_78," (%dd%d)",(ulong)poVar2->dd,(ulong)poVar2->ds);
  }
  _Var3 = flag_has_dbg(poVar2->kind->kind_flags,4,0x17,"obj->kind->kind_flags","KF_SHOW_MULT");
  if (_Var3) {
    strnfcat(buf,sVar11,&local_78," (x%d)",
             (ulong)(uint)((int)poVar2->modifiers[0xc] + (int)poVar2->pval));
  }
  if (((mode & 0x20) == 0) && (poVar13 = local_98, sVar12 = local_78, (poVar2->notice & 2) == 0))
  goto LAB_0018a12f;
  wVar7 = (wchar_t)iVar19;
  wVar8 = object_to_hit(poVar2);
  wVar9 = object_to_dam(poVar2);
  wVar10 = object_to_ac(poVar2);
  ppVar25 = local_90;
  if (((local_90 != (player *)0x0) && ((local_90->obj_k->to_h == 0 || (local_90->obj_k->to_d == 0)))
      ) || (((_Var3 = tval_is_weapon(poVar2), wVar9 == L'\0' && !_Var3 &&
             ((wVar8 == L'\0' || (_Var3 = tval_is_body_armor(poVar2), _Var3)))) &&
            (((_Var3 = object_has_standard_to_h(poVar2), _Var3 && (wVar8 == poVar2->to_h)) ||
             ((poVar2->artifact != (artifact *)0x0 || (poVar2->ego != (ego_item *)0x0)))))))) {
    if ((poVar2->to_h < 0) && (_Var3 = object_has_standard_to_h(poVar2), _Var3)) {
      uVar21 = (ulong)(uint)(int)poVar2->to_h;
LAB_0018a071:
      strnfcat(buf,sVar11,&local_78," (%+d)",uVar21);
      goto LAB_0018a078;
    }
    if (wVar9 == L'\0') {
      if (wVar8 == L'\0') goto LAB_0018a078;
      if (ppVar25 != (player *)0x0) {
        poVar14 = ppVar25->obj_k;
        goto LAB_0018a053;
      }
LAB_0018a05a:
      uVar21 = (ulong)(uint)wVar8;
      goto LAB_0018a071;
    }
    if ((ppVar25 == (player *)0x0) || (poVar14 = ppVar25->obj_k, poVar14->to_d != 0)) {
      uVar21 = (ulong)(uint)wVar9;
      goto LAB_0018a071;
    }
    if (wVar8 != L'\0') {
LAB_0018a053:
      if (poVar14->to_h != 0) goto LAB_0018a05a;
    }
LAB_0018a084:
    if (poVar14->to_a != 0) {
      if (poVar14->ac != 0) goto LAB_0018a094;
      goto LAB_0018a0cd;
    }
    poVar13 = local_98;
    sVar12 = local_78;
    if ((poVar14->ac == 0) ||
       ((poVar2->ac == 0 &&
        (_Var3 = tval_is_armor(poVar2), poVar13 = local_98, sVar12 = local_78, !_Var3))))
    goto LAB_0018a12f;
    pcVar18 = " [%d]";
  }
  else {
    strnfcat(buf,sVar11,&local_78," (%+d,%+d)",(ulong)(uint)wVar8,(ulong)(uint)wVar9);
LAB_0018a078:
    if (ppVar25 != (player *)0x0) {
      poVar14 = ppVar25->obj_k;
      goto LAB_0018a084;
    }
LAB_0018a094:
    if ((poVar2->ac != 0) || (_Var3 = tval_is_armor(poVar2), _Var3)) {
      strnfcat(buf,sVar11,&local_78," [%d,%+d]",(ulong)(uint)wVar7,(ulong)(uint)wVar10);
      poVar13 = local_98;
      sVar12 = local_78;
      goto LAB_0018a12f;
    }
LAB_0018a0cd:
    poVar13 = local_98;
    sVar12 = local_78;
    if (poVar2->to_a == 0) goto LAB_0018a12f;
    pcVar18 = " [%+d]";
    wVar7 = wVar10;
  }
  strnfcat(buf,sVar11,&local_78,pcVar18,(ulong)(uint)wVar7);
  poVar13 = local_98;
  sVar12 = local_78;
LAB_0018a12f:
  if ((mode & 2) != 0) {
    poVar2 = poVar13->known;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    uStack_70 = 0;
    local_38 = 0;
    lVar16 = 0;
    uVar20 = 0;
LAB_0018a16a:
    do {
      sVar1 = poVar2->modifiers[lVar16];
      iVar17 = (int)sVar1;
      local_a0 = sVar12;
      if (sVar1 != 0) {
        if (uVar20 == 0) {
          local_78._0_4_ = iVar17;
          lVar16 = lVar16 + 1;
          uVar20 = 1;
          if (lVar16 == 0x11) {
            strnfcat(buf,sVar11,&local_a0," <");
            uVar20 = 1;
            goto LAB_0018a1fe;
          }
          goto LAB_0018a16a;
        }
        if ((int)uVar20 < 1) {
          uVar21 = 0;
LAB_0018a1a3:
          if ((uint)uVar21 != uVar20) goto LAB_0018a1b0;
        }
        else {
          uVar21 = 0;
          do {
            if (*(int *)((long)&local_78 + uVar21 * 4) == iVar17) goto LAB_0018a1a3;
            uVar21 = uVar21 + 1;
          } while (uVar20 != uVar21);
        }
        lVar22 = (long)(int)uVar20;
        uVar20 = uVar20 + 1;
        *(int *)((long)&local_78 + lVar22 * 4) = iVar17;
      }
LAB_0018a1b0:
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x11);
    if (uVar20 != 0) {
      strnfcat(buf,sVar11,&local_a0," <");
      if (0 < (int)uVar20) {
LAB_0018a1fe:
        sVar11 = local_88;
        uVar21 = 0;
        do {
          if (uVar21 != 0) {
            strnfcat(buf,sVar11,&local_a0,", ");
          }
          strnfcat(buf,sVar11,&local_a0,"%+d",(ulong)*(uint *)((long)&local_78 + uVar21 * 4));
          uVar21 = uVar21 + 1;
        } while (uVar20 != uVar21);
      }
      sVar11 = local_88;
      strnfcat(buf,local_88,&local_a0,">");
      poVar13 = local_98;
    }
    local_78 = local_a0;
    _Var3 = object_flavor_is_aware(poVar13);
    if (((mode & 4) == 0 && !_Var3) || (_Var3 = tval_can_have_charges(poVar13), !_Var3)) {
      ppVar25 = local_90;
      if (0 < poVar13->timeout) {
        _Var3 = tval_is_rod(poVar13);
        if ((_Var3) && (1 < poVar13->number)) {
          wVar7 = number_charging(poVar13);
          strnfcat(buf,sVar11,&local_78," (%d charging)",(ulong)(uint)wVar7);
        }
        else {
          _Var3 = tval_is_rod(poVar13);
          if ((_Var3) ||
             ((poVar13->activation != (activation *)0x0 || (poVar13->effect != (effect *)0x0)))) {
            strnfcat(buf,sVar11,&local_78," (charging)");
          }
        }
      }
    }
    else {
      pcVar18 = "s";
      if ((int)poVar13->pval == 1) {
        pcVar18 = "";
      }
      strnfcat(buf,sVar11,&local_78," (%d charge%s)",(ulong)(uint)(int)poVar13->pval,pcVar18);
      ppVar25 = local_90;
    }
    if ((mode & 4) == 0) {
      sVar12 = obj_desc_inscrip(poVar13,buf,sVar11,local_78,ppVar25);
    }
    else {
      sVar12 = obj_desc_aware(poVar13,buf,sVar11,local_78);
    }
  }
  return sVar12;
}

Assistant:

size_t object_desc(char *buf, size_t max, const struct object *obj,
		uint32_t mode, const struct player *p)
{
	bool prefix = mode & ODESC_PREFIX ? true : false;
	bool spoil = mode & ODESC_SPOIL ? true : false;
	bool terse = mode & ODESC_TERSE ? true : false;

	size_t end = 0;

	/* Simple description for null item */
	if (!obj || !obj->known)
		return strnfmt(buf, max, "(nothing)");

	/* Unknown itema and cash get straightforward descriptions */
	if (obj->known && obj->kind != obj->known->kind) {
		if (prefix)
			return strnfmt(buf, max, "an unknown item");
		return strnfmt(buf, max, "unknown item");
	}

	if (tval_is_money(obj))
		return strnfmt(buf, max, "%d gold pieces worth of %s%s",
				obj->pval, obj->kind->name,
				ignore_item_ok(p, obj) ? " {ignore}" : "");

	/* Egos and kinds whose name we know are seen */
	if (obj->known->ego && !spoil)
		obj->ego->everseen = true;

	if (object_flavor_is_aware(obj) && !spoil)
		obj->kind->everseen = true;

	/** Construct the name **/

	/* Copy the base name to the buffer */
	end = obj_desc_name(buf, max, end, obj, prefix, mode, terse, p);

	/* Combat properties */
	if (mode & ODESC_COMBAT) {
		if (tval_is_chest(obj))
			end = obj_desc_chest(obj, buf, max, end);
		else if (tval_is_light(obj))
			end = obj_desc_light(obj, buf, max, end);

		end = obj_desc_combat(obj->known, buf, max, end, mode, p);
	}

	/* Modifiers, charges, flavour details, inscriptions */
	if (mode & ODESC_EXTRA) {
		end = obj_desc_mods(obj->known, buf, max, end);

		end = obj_desc_charges(obj, buf, max, end, mode);

		if (mode & ODESC_STORE)
			end = obj_desc_aware(obj, buf, max, end);
		else
			end = obj_desc_inscrip(obj, buf, max, end, p);
	}

	return end;
}